

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::handletext(Fl_Input_ *this,int event,int X,int Y,int W,int H)

{
  byte *pbVar1;
  byte bVar2;
  Fl_Font font;
  Fl_Fontsize size;
  int H_00;
  Fl_When FVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint shortcut;
  Fl_Window *pFVar7;
  Fl_Input_ *pFVar8;
  char *pcVar9;
  undefined4 in_register_00000014;
  bool bVar10;
  int local_a0;
  byte *local_50;
  char *p_1;
  char *p;
  char *e;
  char *t;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  int event_local;
  Fl_Input_ *this_local;
  
  switch(event) {
  case 1:
    iVar4 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar4 != 0) &&
       (pFVar7 = Fl_Widget::window(&this->super_Fl_Widget), pFVar7 != (Fl_Window *)0x0)) {
      pFVar7 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar7,FL_CURSOR_INSERT);
    }
    iVar4 = Fl::event_state(0x10000);
    handle_mouse(this,X,Y,W,H,iVar4);
    pFVar8 = (Fl_Input_ *)Fl::focus();
    if (pFVar8 != this) {
      Fl::focus(&this->super_Fl_Widget);
      (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6);
    }
    this_local._4_4_ = 1;
    break;
  case 2:
    copy(this,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)CONCAT44(in_register_00000014,X));
    this_local._4_4_ = 1;
    break;
  case 3:
  case 0xb:
    iVar4 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar4 != 0) &&
       (pFVar7 = Fl_Widget::window(&this->super_Fl_Widget), pFVar7 != (Fl_Window *)0x0)) {
      pFVar7 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar7,FL_CURSOR_INSERT);
    }
    this_local._4_4_ = 1;
    break;
  case 4:
    iVar4 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar4 != 0) &&
       (pFVar7 = Fl_Widget::window(&this->super_Fl_Widget), pFVar7 != (Fl_Window *)0x0)) {
      pFVar7 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar7,FL_CURSOR_DEFAULT);
    }
    this_local._4_4_ = 1;
    break;
  case 5:
    handle_mouse(this,X,Y,W,H,1);
    this_local._4_4_ = 1;
    break;
  case 6:
    font = textfont(this);
    size = textsize(this);
    iVar4 = Fl_Widget::x(&this->super_Fl_Widget);
    iVar5 = Fl_Widget::y(&this->super_Fl_Widget);
    iVar6 = Fl_Widget::w(&this->super_Fl_Widget);
    H_00 = Fl_Widget::h(&this->super_Fl_Widget);
    pFVar7 = Fl_Widget::window(&this->super_Fl_Widget);
    fl_set_spot(font,size,iVar4,iVar5,iVar6,H_00,pFVar7);
    if (this->mark_ == this->position_) {
      iVar4 = Fl_Input_::size(this);
      minimal_update(this,iVar4 + 1);
    }
    else {
      minimal_update(this,this->mark_,this->position_);
    }
    this_local._4_4_ = 1;
    break;
  case 7:
    iVar4 = Fl_Widget::active_r(&this->super_Fl_Widget);
    if ((iVar4 != 0) &&
       (pFVar7 = Fl_Widget::window(&this->super_Fl_Widget), pFVar7 != (Fl_Window *)0x0)) {
      pFVar7 = Fl_Widget::window(&this->super_Fl_Widget);
      Fl_Window::cursor(pFVar7,FL_CURSOR_DEFAULT);
    }
    if (this->mark_ == this->position_) {
      bVar2 = Fl_Widget::damage(&this->super_Fl_Widget);
      if ((bVar2 & 2) == 0) {
        minimal_update(this,this->position_);
        this->erase_cursor_only = '\x01';
      }
    }
    else {
      minimal_update(this,this->mark_,this->position_);
    }
  case 0xf:
    fl_reset_spot();
    iVar4 = readonly(this);
    if ((iVar4 == 0) &&
       (FVar3 = Fl_Widget::when(&this->super_Fl_Widget), (FVar3 & FL_WHEN_RELEASE) != FL_WHEN_NEVER)
       ) {
      maybe_do_callback(this);
    }
    this_local._4_4_ = 1;
    break;
  case 0xc:
    iVar4 = Fl_Input_::shortcut(this);
    if (iVar4 == 0) {
      local_a0 = Fl_Widget::test_shortcut(&this->super_Fl_Widget);
    }
    else {
      shortcut = Fl_Input_::shortcut(this);
      local_a0 = Fl::test_shortcut(shortcut);
    }
    if (local_a0 == 0) {
      return 0;
    }
    iVar4 = Fl::visible_focus();
    if ((iVar4 != 0) && (iVar4 = (*(this->super_Fl_Widget)._vptr_Fl_Widget[3])(this,6), iVar4 != 0))
    {
      Fl::focus(&this->super_Fl_Widget);
      return 1;
    }
  default:
    this_local._4_4_ = 0;
    break;
  case 0x11:
    iVar4 = readonly(this);
    if (iVar4 == 0) {
      pcVar9 = Fl::event_text();
      if ((pcVar9 == (char *)0x0) || (iVar4 = Fl::event_length(), iVar4 == 0)) {
        this_local._4_4_ = 1;
      }
      else {
        e = Fl::event_text();
        iVar4 = Fl::event_length();
        p = e + iVar4;
        iVar4 = input_type(this);
        if (iVar4 != 4) {
          while( true ) {
            bVar10 = false;
            if (e < p) {
              iVar4 = isspace((uint)(byte)p[-1]);
              bVar10 = iVar4 != 0;
            }
            if (!bVar10) break;
            p = p + -1;
          }
        }
        if ((e == (char *)0x0) || (p <= e)) {
          this_local._4_4_ = 1;
        }
        else {
          iVar5 = input_type(this);
          iVar4 = (int)p;
          if (iVar5 == 2) {
            for (; iVar5 = isspace((uint)(byte)*e), iVar5 != 0 && e < p; e = e + 1) {
            }
            p_1 = e;
            if ((*e == '+') || (*e == '-')) {
              p_1 = e + 1;
            }
            iVar5 = strncmp(p_1,"0x",2);
            if (iVar5 == 0) {
              for (p_1 = p_1 + 2; iVar5 = isxdigit((uint)(byte)*p_1), iVar5 != 0 && p_1 < p;
                  p_1 = p_1 + 1) {
              }
            }
            else {
              for (; iVar5 = isdigit((uint)(byte)*p_1), iVar5 != 0 && p_1 < p; p_1 = p_1 + 1) {
              }
            }
            if (p_1 < p) {
              fl_beep(2);
              this_local._4_4_ = 1;
            }
            else {
              iVar5 = Fl_Input_::size(this);
              this_local._4_4_ = replace(this,0,iVar5,e,iVar4 - (int)e);
            }
          }
          else {
            iVar5 = input_type(this);
            if (iVar5 == 1) {
              for (; iVar5 = isspace((uint)(byte)*e), iVar5 != 0 && e < p; e = e + 1) {
              }
              local_50 = (byte *)e;
              if ((*e == '+') || (*e == '-')) {
                local_50 = (byte *)(e + 1);
              }
              for (; iVar5 = isdigit((uint)*local_50), iVar5 != 0 && local_50 < p;
                  local_50 = local_50 + 1) {
              }
              if (*local_50 == 0x2e) {
                do {
                  pbVar1 = local_50;
                  local_50 = pbVar1 + 1;
                  iVar5 = isdigit((uint)*local_50);
                } while (iVar5 != 0 && local_50 < p);
                if ((*local_50 == 0x65) || (*local_50 == 0x45)) {
                  local_50 = pbVar1 + 2;
                  if ((*local_50 == 0x2b) || (*local_50 == 0x2d)) {
                    local_50 = pbVar1 + 3;
                  }
                  for (; iVar5 = isdigit((uint)*local_50), iVar5 != 0 && local_50 < p;
                      local_50 = local_50 + 1) {
                  }
                }
              }
              if (local_50 < p) {
                fl_beep(2);
                this_local._4_4_ = 1;
              }
              else {
                iVar5 = Fl_Input_::size(this);
                this_local._4_4_ = replace(this,0,iVar5,e,iVar4 - (int)e);
              }
            }
            else {
              iVar5 = position(this);
              iVar6 = mark(this);
              this_local._4_4_ = replace(this,iVar5,iVar6,e,iVar4 - (int)e);
            }
          }
        }
      }
    }
    else {
      fl_beep(2);
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::handletext(int event, int X, int Y, int W, int H) {
  switch (event) {

  case FL_ENTER:
  case FL_MOVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);
    return 1;

  case FL_LEAVE:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    return 1;

  case FL_FOCUS:
    fl_set_spot(textfont(), textsize(), x(), y(), w(), h(), window());
    if (mark_ == position_) {
      minimal_update(size()+1);
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
    return 1;

  case FL_UNFOCUS:
    if (active_r() && window()) window()->cursor(FL_CURSOR_DEFAULT);
    if (mark_ == position_) {
      if (!(damage()&FL_DAMAGE_EXPOSE)) {minimal_update(position_); erase_cursor_only = 1;}
    } else //if (Fl::selection_owner() != this)
      minimal_update(mark_, position_);
  case FL_HIDE:
    fl_reset_spot();
    if (!readonly() && (when() & FL_WHEN_RELEASE))
      maybe_do_callback();
    return 1;

  case FL_PUSH:
    if (active_r() && window()) window()->cursor(FL_CURSOR_INSERT);

    handle_mouse(X, Y, W, H, Fl::event_state(FL_SHIFT));

    if (Fl::focus() != this) {
      Fl::focus(this);
      handle(FL_FOCUS);
    }
    return 1;

  case FL_DRAG:
    handle_mouse(X, Y, W, H, 1);
    return 1;

  case FL_RELEASE:
    copy(0);
    return 1;

  case FL_PASTE: {
    // Don't allow pastes into readonly widgets...
    if (readonly()) {
      fl_beep(FL_BEEP_ERROR);
      return 1;
    }

    // See if we have anything to paste...
    if (!Fl::event_text() || !Fl::event_length()) return 1;

    // strip trailing control characters and spaces before pasting:
    const char* t = Fl::event_text();
    const char* e = t+Fl::event_length();
    if (input_type() != FL_MULTILINE_INPUT) while (e > t && isspace(*(e-1) & 255)) e--;
    if (!t || e <= t) return 1; // Int/float stuff will crash without this test
    if (input_type() == FL_INT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      if (strncmp(p, "0x", 2) == 0) {
        p += 2;
        while (isxdigit(*p & 255) && p < e) p ++;
      } else {
        while (isdigit(*p & 255) && p < e) p ++;
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    } else if (input_type() == FL_FLOAT_INPUT) {
      while (isspace(*t & 255) && t < e) t ++;
      const char *p = t;
      if (*p == '+' || *p == '-') p ++;
      while (isdigit(*p & 255) && p < e) p ++;
      if (*p == '.') {
        p ++;
        while (isdigit(*p & 255) && p < e) p ++;
	if (*p == 'e' || *p == 'E') {
	  p ++;
	  if (*p == '+' || *p == '-') p ++;
	  while (isdigit(*p & 255) && p < e) p ++;
	}
      }
      if (p < e) {
        fl_beep(FL_BEEP_ERROR);
        return 1;
      } else return replace(0, size(), t, (int) (e-t));
    }
    return replace(position(), mark(), t, (int) (e-t));}

  case FL_SHORTCUT:
    if (!(shortcut() ? Fl::test_shortcut(shortcut()) : test_shortcut())) 
      return 0;
    if (Fl::visible_focus() && handle(FL_FOCUS)) {
      Fl::focus(this);
      return 1;
    } // else fall through

  default:
    return 0;
  }
}